

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O3

Real __thiscall amrex::MultiFab::sum_unique(MultiFab *this,int comp,bool local,Periodicity *period)

{
  FabArray<amrex::FArrayBox> *this_00;
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  Real RVar10;
  double dVar11;
  MFIter mfi;
  Real local_160;
  FabArray<amrex::IArrayBox> *local_158;
  long local_150;
  FabArray<amrex::FArrayBox> *local_148;
  long local_140;
  ulong local_138;
  Box local_12c;
  Array4<const_double> local_110;
  Array4<const_int> local_d0;
  MFIter local_90;
  
  lVar1 = 0xc;
  switch((this->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_bat_type) {
  default:
    lVar1 = 0x10;
  case indexType:
  case indexType_coarsenRatio:
    if (*(int *)((long)&(this->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                        _vptr_FabArrayBase + lVar1) != 0) {
      local_90.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
            )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
      local_90.fabArray._0_4_ = 0;
      amrex::OwnerMask((amrex *)&local_158,(FabArrayBase *)this,period,(IntVect *)&local_90);
      MFIter::MFIter(&local_90,(FabArrayBase *)this,true);
      local_160 = 0.0;
      if (local_90.currentIndex < local_90.endIndex) {
        local_150 = (long)comp << 3;
        local_160 = 0.0;
        local_148 = &this->super_FabArray<amrex::FArrayBox>;
        do {
          this_00 = local_148;
          MFIter::tilebox(&local_12c,&local_90);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_110,this_00,&local_90)
          ;
          FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                    (&local_d0,local_158,&local_90);
          lVar1 = (long)local_12c.smallend.vect[2];
          dVar9 = 0.0;
          if (local_12c.smallend.vect[2] <= local_12c.bigend.vect[2]) {
            local_138 = (ulong)(uint)local_12c.bigend.vect[1];
            lVar2 = (long)local_12c.smallend.vect[1];
            local_140 = local_110.kstride * 8;
            lVar4 = local_110.nstride * local_150 +
                    (lVar2 - local_110.begin.y) * local_110.jstride * 8 +
                    (lVar1 - local_110.begin.z) * local_140 + (long)local_12c.smallend.vect[0] * 8 +
                    (long)local_110.begin.x * -8 + (long)local_110.p;
            lVar8 = (lVar2 - local_d0.begin.y) * local_d0.jstride * 4 +
                    (lVar1 - local_d0.begin.z) * local_d0.kstride * 4 +
                    (long)local_12c.smallend.vect[0] * 4 + (long)local_d0.begin.x * -4 +
                    (long)local_d0.p;
            do {
              lVar3 = lVar8;
              lVar5 = lVar2;
              lVar7 = lVar4;
              if (local_12c.smallend.vect[1] <= local_12c.bigend.vect[1]) {
                do {
                  if (local_12c.smallend.vect[0] <= local_12c.bigend.vect[0]) {
                    lVar6 = 0;
                    do {
                      if (*(int *)(lVar3 + lVar6 * 4) == 0) {
                        dVar11 = 0.0;
                      }
                      else {
                        dVar11 = *(double *)(lVar7 + lVar6 * 8);
                      }
                      dVar9 = dVar9 + dVar11;
                      lVar6 = lVar6 + 1;
                    } while ((local_12c.bigend.vect[0] - local_12c.smallend.vect[0]) + 1 !=
                             (int)lVar6);
                  }
                  lVar5 = lVar5 + 1;
                  lVar7 = lVar7 + local_110.jstride * 8;
                  lVar3 = lVar3 + local_d0.jstride * 4;
                } while (local_12c.bigend.vect[1] + 1U != (int)lVar5);
              }
              lVar1 = lVar1 + 1;
              lVar4 = lVar4 + local_140;
              lVar8 = lVar8 + local_d0.kstride * 4;
            } while (local_12c.bigend.vect[2] + 1 != (int)lVar1);
          }
          local_160 = local_160 + dVar9;
          MFIter::operator++(&local_90);
        } while (local_90.currentIndex < local_90.endIndex);
      }
      MFIter::~MFIter(&local_90);
      if (local_158 != (FabArray<amrex::IArrayBox> *)0x0) {
        (*(local_158->super_FabArrayBase)._vptr_FabArrayBase[1])();
      }
      return local_160;
    }
  case null:
  case coarsenRatio:
    RVar10 = sum(this,comp,false);
    return RVar10;
  }
}

Assistant:

Real
MultiFab::sum_unique (int comp,
                      bool local,
                      const Periodicity& period) const
{
    BL_PROFILE("MultiFab::sum_unique()");

    // no duplicatly distributed points if cell centered
    if (ixType().cellCentered())
        return this->sum(comp, local);

    // Owner is the grid with the lowest grid number containing the data
    std::unique_ptr<iMultiFab> owner_mask = OwnerMask(period);

    Real sm = Real(0.0);
#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        auto const& ma = this->const_arrays();
        auto const& msk = owner_mask->const_arrays();
        sm = ParReduce(TypeList<ReduceOpSum>{}, TypeList<Real>{}, *this, IntVect(0),
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
                       -> GpuTuple<Real>
        {
            return msk[box_no](i,j,k) ? ma[box_no](i,j,k,comp) : 0.0_rt;
        });
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (!system::regtest_reduction) reduction(+:sm)
#endif
        for (MFIter mfi(*this,true); mfi.isValid(); ++mfi)
        {
            Box const& bx = mfi.tilebox();
            Array4<Real const> const& a = this->const_array(mfi);
            Array4<int const> const& msk = owner_mask->const_array(mfi);
            Real tmp = 0.0_rt;
            AMREX_LOOP_3D(bx, i, j, k,
            {
                tmp += msk(i,j,k) ? a(i,j,k,comp) : 0.0_rt;
            });
            sm += tmp; // Do it this way so that it does not break regression tests.
        }
    }

    if (!local) {
        ParallelAllReduce::Sum(sm, ParallelContext::CommunicatorSub());
    }

    return sm;
}